

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::performSolutionPolishing
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  cpp_dec_float<50U,_int,_void> *pcVar1;
  uint *puVar2;
  byte bVar3;
  uint n;
  uint n_00;
  fpclass_type fVar4;
  SPxOut *pSVar5;
  pointer pnVar6;
  char cVar7;
  undefined8 uVar8;
  int32_t iVar9;
  undefined1 auVar10 [16];
  bool bVar11;
  bool bVar12;
  Status SVar13;
  int iVar14;
  int iVar15;
  cpp_dec_float<50U,_int,_void> *pcVar16;
  ostream **in_RCX;
  Status **ppSVar17;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *this_00;
  ulong uVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  int i;
  ulong uVar23;
  Real RVar24;
  SPxId polishId;
  DIdxSet slackcandidates;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  DIdxSet continuousvars;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  origval;
  char local_611;
  DataKey local_610;
  DIdxSet local_608;
  cpp_dec_float<50U,_int,_void> local_5e8;
  ulong local_5b0;
  Status *local_5a8;
  Status **local_5a0;
  int local_594;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_590;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_558;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4f8;
  fpclass_type local_4f0;
  byte local_4ec;
  undefined8 local_4e8;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_4e0;
  fpclass_type local_4d8;
  int32_t iStack_4d4;
  undefined8 uStack_4d0;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_4c0;
  undefined1 local_4b8 [32];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_498;
  fpclass_type local_490;
  bool local_48c;
  undefined8 local_488;
  undefined1 local_478 [32];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_458;
  fpclass_type local_450;
  bool local_44c;
  undefined8 local_448;
  DIdxSet local_438;
  undefined8 local_418;
  undefined8 uStack_410;
  Status **local_400;
  uint local_3f8 [2];
  uint auStack_3f0 [2];
  uint local_3e8;
  uint uStack_3e4;
  uint uStack_3e0;
  uint uStack_3dc;
  uint local_3d8 [4];
  uint local_3c8 [2];
  uint auStack_3c0 [2];
  uint local_3b8 [2];
  undefined8 uStack_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a8;
  uint local_398 [2];
  uint auStack_390 [2];
  uint local_388 [2];
  undefined8 uStack_380;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_378;
  uint local_368 [2];
  uint auStack_360 [2];
  uint local_358 [2];
  undefined8 uStack_350;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_348;
  cpp_dec_float<50U,_int,_void> local_338;
  cpp_dec_float<50U,_int,_void> local_2f8;
  cpp_dec_float<50U,_int,_void> local_2b8;
  cpp_dec_float<50U,_int,_void> local_278;
  cpp_dec_float<50U,_int,_void> local_238;
  cpp_dec_float<50U,_int,_void> local_1f8;
  cpp_dec_float<50U,_int,_void> local_1c0;
  cpp_dec_float<50U,_int,_void> local_188;
  cpp_dec_float<50U,_int,_void> local_150;
  cpp_dec_float<50U,_int,_void> local_118;
  uint local_e0 [2];
  uint auStack_d8 [2];
  uint local_d0 [2];
  uint auStack_c8 [2];
  uint local_c0 [2];
  int local_b8;
  undefined1 local_b4;
  fpclass_type local_b0;
  int32_t iStack_ac;
  cpp_dec_float<50U,_int,_void> local_a8;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  if (((-1 < this->maxIters) &&
      (this->maxIters <=
       (this->
       super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).iterCount)) && (bVar11 = isTimeLimitReached(this,false), !bVar11)) {
    return false;
  }
  if ((this->polishObj == POLISH_OFF) || (SVar13 = status(this), SVar13 != OPTIMAL)) {
    bVar11 = false;
  }
  else {
    local_5a8 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data;
    local_5a0 = (Status **)
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data;
    local_610.info = 0;
    local_610.idx = -1;
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x5e])(local_e0,this);
    pSVar5 = this->spxout;
    if ((pSVar5 != (SPxOut *)0x0) && (3 < (int)pSVar5->m_verbosity)) {
      local_5e8.data._M_elems[0] = pSVar5->m_verbosity;
      local_590.m_backend.data._M_elems[0] = 4;
      (*pSVar5->_vptr_SPxOut[2])();
      pSVar5 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar5->m_streams[pSVar5->m_verbosity]," --- perform solution polishing",0x1f);
      in_RCX = pSVar5->m_streams;
      cVar7 = (char)in_RCX[pSVar5->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)in_RCX[pSVar5->m_verbosity] + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_5e8);
    }
    if (this->theRep == COLUMN) {
      setType(this,ENTER);
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x76])(this);
      entertol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_5e8,this);
      local_3d8[0] = local_5e8.data._M_elems[8];
      local_3d8[1] = local_5e8.data._M_elems[9];
      local_3e8 = local_5e8.data._M_elems[4];
      uStack_3e4 = local_5e8.data._M_elems[5];
      uStack_3e0 = local_5e8.data._M_elems[6];
      uStack_3dc = local_5e8.data._M_elems[7];
      local_3f8[0] = local_5e8.data._M_elems[0];
      local_3f8[1] = local_5e8.data._M_elems[1];
      auStack_3f0[0] = local_5e8.data._M_elems[2];
      auStack_3f0[1] = local_5e8.data._M_elems[3];
      local_594 = local_5e8.exp;
      local_611 = local_5e8.neg;
      local_418._0_4_ = local_5e8.fpclass;
      local_418._4_4_ = local_5e8.prec_elem;
      uStack_410 = 0;
      this->instableEnter = false;
      (*this->theratiotester->_vptr_SPxRatioTester[9])
                (this->theratiotester,(ulong)(uint)this->theType);
      if (this->polishObj == POLISH_INTEGRALITY) {
        n = (this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum;
        n_00 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
        DIdxSet::DIdxSet(&local_608,n);
        local_5b0 = (ulong)n_00;
        DIdxSet::DIdxSet(&local_438,n_00);
        if (0 < (int)n) {
          lVar22 = 0x30;
          uVar19 = 0;
          do {
            if ((local_5a8[uVar19] | D_ON_UPPER) == P_ON_UPPER) {
              pnVar6 = (this->theCoPvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar18 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          **)((long)(pnVar6->m_backend).data._M_elems + lVar22 + -0x10);
              puVar2 = (uint *)((long)(pnVar6->m_backend).data._M_elems + lVar22 + -0x30);
              local_368 = *(uint (*) [2])puVar2;
              auStack_360 = *(uint (*) [2])(puVar2 + 2);
              puVar2 = (uint *)((long)(pnVar6->m_backend).data._M_elems + lVar22 + -0x20);
              local_358 = *(uint (*) [2])puVar2;
              uStack_350 = *(undefined8 *)(puVar2 + 2);
              fVar4 = *(fpclass_type *)((long)(pnVar6->m_backend).data._M_elems + lVar22 + -8);
              bVar3 = *(byte *)((long)(pnVar6->m_backend).data._M_elems + lVar22 + -4);
              _local_4d8 = *(undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar22);
              uStack_4d0 = 0;
              local_348 = pnVar18;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_118,0,(type *)0x0);
              RVar24 = Tolerances::epsilon((this->
                                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
              local_238.fpclass = cpp_dec_float_finite;
              local_238.prec_elem = 10;
              local_238.data._M_elems[0] = 0;
              local_238.data._M_elems[1] = 0;
              local_238.data._M_elems[2] = 0;
              local_238.data._M_elems[3] = 0;
              local_238.data._M_elems[4] = 0;
              local_238.data._M_elems[5] = 0;
              local_238.data._M_elems._24_5_ = 0;
              local_238.data._M_elems[7]._1_3_ = 0;
              local_238.data._M_elems._32_5_ = 0;
              local_238._37_8_ = 0;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_238,RVar24);
              local_518._0_4_ = local_368[0];
              local_518._4_4_ = local_368[1];
              uStack_510._0_4_ = auStack_360[0];
              uStack_510._4_4_ = auStack_360[1];
              local_508._0_4_ = local_358[0];
              local_508._4_4_ = local_358[1];
              uStack_500 = uStack_350;
              local_4f8 = local_348;
              local_4e8._0_4_ = local_4d8;
              local_4e8._4_4_ = iStack_4d4;
              local_558.m_backend.data._M_elems[0] = local_118.data._M_elems[0];
              local_558.m_backend.data._M_elems[1] = local_118.data._M_elems[1];
              local_558.m_backend.data._M_elems[2] = local_118.data._M_elems[2];
              local_558.m_backend.data._M_elems[3] = local_118.data._M_elems[3];
              local_558.m_backend.data._M_elems[4] = local_118.data._M_elems[4];
              local_558.m_backend.data._M_elems[5] = local_118.data._M_elems[5];
              local_558.m_backend.data._M_elems[6] = local_118.data._M_elems[6];
              local_558.m_backend.data._M_elems[7] = local_118.data._M_elems[7];
              local_558.m_backend.data._M_elems[8] = local_118.data._M_elems[8];
              local_558.m_backend.data._M_elems[9] = local_118.data._M_elems[9];
              local_558.m_backend.exp = local_118.exp;
              local_558.m_backend.neg = local_118.neg;
              local_558.m_backend.fpclass = local_118.fpclass;
              local_558.m_backend.prec_elem = local_118.prec_elem;
              local_4f0 = fVar4;
              local_4ec = bVar3;
              relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                        (&local_590,(soplex *)&local_518,&local_558,pnVar18);
              local_5e8.data._M_elems[8] = local_590.m_backend.data._M_elems[8];
              local_5e8.data._M_elems[9] = local_590.m_backend.data._M_elems[9];
              local_5e8.data._M_elems[1] = local_590.m_backend.data._M_elems[1];
              local_5e8.data._M_elems[0] = local_590.m_backend.data._M_elems[0];
              local_5e8.data._M_elems[2] = local_590.m_backend.data._M_elems[2];
              local_5e8.data._M_elems[3] = local_590.m_backend.data._M_elems[3];
              local_5e8.exp = local_590.m_backend.exp;
              local_5e8.neg = local_590.m_backend.neg;
              local_5e8.fpclass = local_590.m_backend.fpclass;
              local_5e8.prec_elem = local_590.m_backend.prec_elem;
              in_RCX = (ostream **)(local_590.m_backend._48_8_ & P_FREE);
              if ((local_590.m_backend.neg == true) &&
                 (local_590.m_backend.data._M_elems[0] != 0 || local_590.m_backend.fpclass != 0)) {
                local_5e8.neg = false;
              }
              if (((local_590.m_backend.fpclass != 2) && (local_238.fpclass != cpp_dec_float_NaN))
                 && (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              compare(&local_5e8,&local_238), iVar14 < 1)) {
                DIdxSet::addIdx(&local_608,(int)uVar19);
              }
            }
            uVar19 = uVar19 + 1;
            lVar22 = lVar22 + 0x38;
          } while (n != uVar19);
        }
        uVar19 = local_5b0;
        in_RCX = (ostream **)((ulong)in_RCX & 0xffffffffffffff00);
        if (0 < (int)local_5b0 && (this->integerVariables).thesize == (int)local_5b0) {
          lVar22 = 0x30;
          uVar23 = 0;
          do {
            if ((*(Status *)((long)local_5a0 + uVar23 * 4) | D_ON_UPPER) == P_ON_UPPER) {
              pnVar18 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .object.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pcVar16 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)(pnVar18->m_backend).data._M_elems + lVar22 + -0x30);
              pcVar1 = (cpp_dec_float<50U,_int,_void> *)
                       ((long)(((this->thePvec->
                                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                       + lVar22 + -0x30);
              local_448._0_4_ = cpp_dec_float_finite;
              local_448._4_4_ = 10;
              local_478._0_16_ = (undefined1  [16])0x0;
              local_478._16_4_ = 0;
              local_478._20_4_ = 0;
              local_478._24_5_ = 0;
              local_478._29_3_ = 0;
              local_458 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)0x0;
              local_450 = cpp_dec_float_finite;
              local_44c = false;
              if (pcVar1 == (cpp_dec_float<50U,_int,_void> *)local_478) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)local_478,pcVar16);
                if (local_478._0_4_ != 0 || (fpclass_type)local_448 != cpp_dec_float_finite) {
                  local_44c = (bool)(local_44c ^ 1);
                }
              }
              else {
                if (pcVar16 != (cpp_dec_float<50U,_int,_void> *)local_478) {
                  local_458 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                **)((long)(pnVar18->m_backend).data._M_elems + lVar22 + -0x10);
                  local_478._0_16_ = *(undefined1 (*) [16])(pcVar16->data)._M_elems;
                  local_478._16_8_ =
                       *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar22 + -0x20);
                  uVar8 = *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar22 + -0x18)
                  ;
                  local_478._24_5_ = (undefined5)uVar8;
                  local_478._29_3_ = (undefined3)((ulong)uVar8 >> 0x28);
                  local_450 = *(fpclass_type *)
                               ((long)(pnVar18->m_backend).data._M_elems + lVar22 + -8);
                  local_44c = *(bool *)((long)(pnVar18->m_backend).data._M_elems + lVar22 + -4);
                  local_448 = *(undefined8 *)((long)(pnVar18->m_backend).data._M_elems + lVar22);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)local_478,pcVar1);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_150,0,(type *)0x0);
              RVar24 = Tolerances::epsilon((this->
                                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
              local_278.fpclass = cpp_dec_float_finite;
              local_278.prec_elem = 10;
              local_278.data._M_elems[0] = 0;
              local_278.data._M_elems[1] = 0;
              local_278.data._M_elems[2] = 0;
              local_278.data._M_elems[3] = 0;
              local_278.data._M_elems[4] = 0;
              local_278.data._M_elems[5] = 0;
              local_278.data._M_elems._24_5_ = 0;
              local_278.data._M_elems[7]._1_3_ = 0;
              local_278.data._M_elems._32_5_ = 0;
              local_278._37_8_ = 0;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_278,RVar24);
              auVar10 = local_478._0_16_;
              uStack_500 = CONCAT35(local_478._29_3_,local_478._24_5_);
              local_518._0_4_ = local_478._0_4_;
              local_518._4_4_ = local_478._4_4_;
              uStack_510._0_4_ = local_478._8_4_;
              uStack_510._4_4_ = local_478._12_4_;
              local_508._0_4_ = local_478._16_4_;
              local_508._4_4_ = local_478._20_4_;
              local_4f8 = local_458;
              local_4f0 = local_450;
              local_4ec = local_44c;
              local_4e8._0_4_ = (fpclass_type)local_448;
              local_4e8._4_4_ = local_448._4_4_;
              local_558.m_backend.data._M_elems[0] = local_150.data._M_elems[0];
              local_558.m_backend.data._M_elems[1] = local_150.data._M_elems[1];
              local_558.m_backend.data._M_elems[2] = local_150.data._M_elems[2];
              local_558.m_backend.data._M_elems[3] = local_150.data._M_elems[3];
              local_558.m_backend.data._M_elems[4] = local_150.data._M_elems[4];
              local_558.m_backend.data._M_elems[5] = local_150.data._M_elems[5];
              local_558.m_backend.data._M_elems[6] = local_150.data._M_elems[6];
              local_558.m_backend.data._M_elems[7] = local_150.data._M_elems[7];
              local_558.m_backend.data._M_elems[8] = local_150.data._M_elems[8];
              local_558.m_backend.data._M_elems[9] = local_150.data._M_elems[9];
              local_558.m_backend.exp = local_150.exp;
              local_558.m_backend.neg = local_150.neg;
              local_558.m_backend.fpclass = local_150.fpclass;
              local_558.m_backend.prec_elem = local_150.prec_elem;
              local_478._0_16_ = auVar10;
              relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                        (&local_590,(soplex *)&local_518,&local_558,pnVar18);
              local_5e8.data._M_elems[8] = local_590.m_backend.data._M_elems[8];
              local_5e8.data._M_elems[9] = local_590.m_backend.data._M_elems[9];
              local_5e8.data._M_elems[1] = local_590.m_backend.data._M_elems[1];
              local_5e8.data._M_elems[0] = local_590.m_backend.data._M_elems[0];
              local_5e8.data._M_elems[2] = local_590.m_backend.data._M_elems[2];
              local_5e8.data._M_elems[3] = local_590.m_backend.data._M_elems[3];
              local_5e8.exp = local_590.m_backend.exp;
              local_5e8.neg = local_590.m_backend.neg;
              local_5e8.fpclass = local_590.m_backend.fpclass;
              local_5e8.prec_elem = local_590.m_backend.prec_elem;
              in_RCX = (ostream **)(local_590.m_backend._48_8_ & P_FREE);
              if ((local_590.m_backend.neg == true) &&
                 (local_590.m_backend.data._M_elems[0] != 0 || local_590.m_backend.fpclass != 0)) {
                local_5e8.neg = false;
              }
              if (((local_590.m_backend.fpclass != 2) && (local_278.fpclass != cpp_dec_float_NaN))
                 && ((iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(&local_5e8,&local_278), iVar14 < 1 &&
                     ((this->integerVariables).data[uVar23] == 0)))) {
                DIdxSet::addIdx(&local_438,(int)uVar23);
              }
            }
            uVar23 = uVar23 + 1;
            lVar22 = lVar22 + 0x38;
          } while (uVar19 != uVar23);
        }
        bVar11 = false;
        do {
          uVar19 = (ulong)local_608.super_IdxSet.num;
          if (((long)uVar19 < 1) || (bVar11)) {
            iVar14 = 0;
          }
          else {
            iVar14 = 0;
            do {
              local_610 = (DataKey)coId(this,local_608.super_IdxSet.idx[uVar19 - 1]);
              bVar12 = enter(this,(SPxId *)&local_610,true);
              (*(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x88])(this);
              if (bVar12) {
                iVar14 = iVar14 + 1;
                lVar22 = (long)local_608.super_IdxSet.num;
                local_608.super_IdxSet.num = local_608.super_IdxSet.num + -1;
                in_RCX = (ostream **)(ulong)(uint)local_608.super_IdxSet.idx[lVar22 + -1];
                local_608.super_IdxSet.idx[uVar19 - 1] = local_608.super_IdxSet.idx[lVar22 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <=
                    (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).iterCount)) {
                  bVar11 = true;
                }
              }
              bVar12 = isTimeLimitReached(this,false);
              if (bVar12) {
                bVar11 = true;
              }
            } while ((1 < uVar19) && (uVar19 = uVar19 - 1, !bVar11));
          }
          uVar19 = (ulong)local_438.super_IdxSet.num;
          if (0 < (long)uVar19) {
            while (!bVar11) {
              local_610 = (DataKey)id(this,local_438.super_IdxSet.idx[uVar19 - 1]);
              bVar12 = enter(this,(SPxId *)&local_610,true);
              (*(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x88])(this);
              if (bVar12) {
                iVar14 = iVar14 + 1;
                lVar22 = (long)local_438.super_IdxSet.num;
                local_438.super_IdxSet.num = local_438.super_IdxSet.num + -1;
                in_RCX = (ostream **)(ulong)(uint)local_438.super_IdxSet.idx[lVar22 + -1];
                local_438.super_IdxSet.idx[uVar19 - 1] = local_438.super_IdxSet.idx[lVar22 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <=
                    (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).iterCount)) {
                  bVar11 = true;
                }
              }
              bVar12 = isTimeLimitReached(this,false);
              if (bVar12) {
                bVar11 = true;
              }
              if (uVar19 < 2) break;
              uVar19 = uVar19 - 1;
            }
          }
          if (iVar14 == 0) {
            bVar11 = true;
          }
          this->polishCount = this->polishCount + iVar14;
        } while (!bVar11);
        DIdxSet::~DIdxSet(&local_438);
      }
      else {
        DIdxSet::DIdxSet(&local_608,(this->thecovectors->set).thenum);
        if (0 < (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum) {
          lVar22 = 0;
          lVar21 = 0;
          do {
            if ((*(Status *)((long)local_5a0 + lVar21 * 4) | D_ON_UPPER) == P_ON_UPPER) {
              pnVar18 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .object.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pcVar1 = (cpp_dec_float<50U,_int,_void> *)
                       ((long)(pnVar18->m_backend).data._M_elems + lVar22);
              pcVar16 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)(((this->thePvec->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                               _M_elems + lVar22);
              local_488._0_4_ = cpp_dec_float_finite;
              local_488._4_4_ = 10;
              local_4b8._0_16_ = (undefined1  [16])0x0;
              local_4b8._16_4_ = 0;
              local_4b8._20_4_ = 0;
              local_4b8._24_5_ = 0;
              local_4b8._29_3_ = 0;
              local_498 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)0x0;
              local_490 = cpp_dec_float_finite;
              local_48c = false;
              if (pcVar16 == (cpp_dec_float<50U,_int,_void> *)local_4b8) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)local_4b8,pcVar1);
                if (local_4b8._0_4_ != 0 || (fpclass_type)local_488 != cpp_dec_float_finite) {
                  local_48c = (bool)(local_48c ^ 1);
                }
              }
              else {
                if (pcVar1 != (cpp_dec_float<50U,_int,_void> *)local_4b8) {
                  local_498 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                **)((pcVar1->data)._M_elems + 8);
                  local_4b8._0_16_ = *(undefined1 (*) [16])(pcVar1->data)._M_elems;
                  local_4b8._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
                  uVar8 = *(undefined8 *)((pcVar1->data)._M_elems + 6);
                  local_4b8._24_5_ = (undefined5)uVar8;
                  local_4b8._29_3_ = (undefined3)((ulong)uVar8 >> 0x28);
                  local_490 = *(fpclass_type *)((long)(&(pnVar18->m_backend).data + 1) + lVar22);
                  local_48c = *(bool *)((long)(&(pnVar18->m_backend).data + 1) + lVar22 + 4);
                  local_488 = *(undefined8 *)((long)(&(pnVar18->m_backend).data + 1) + lVar22 + 8);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)local_4b8,pcVar16);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_188,0,(type *)0x0);
              RVar24 = Tolerances::epsilon((this->
                                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
              local_a8.fpclass = cpp_dec_float_finite;
              local_a8.prec_elem = 10;
              local_a8.data._M_elems[0] = 0;
              local_a8.data._M_elems[1] = 0;
              local_a8.data._M_elems[2] = 0;
              local_a8.data._M_elems[3] = 0;
              local_a8.data._M_elems[4] = 0;
              local_a8.data._M_elems[5] = 0;
              local_a8.data._M_elems._24_5_ = 0;
              local_a8.data._M_elems[7]._1_3_ = 0;
              local_a8.data._M_elems._32_5_ = 0;
              local_a8._37_8_ = 0;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_a8,RVar24);
              auVar10 = local_4b8._0_16_;
              uStack_500 = CONCAT35(local_4b8._29_3_,local_4b8._24_5_);
              local_518._0_4_ = local_4b8._0_4_;
              local_518._4_4_ = local_4b8._4_4_;
              uStack_510._0_4_ = local_4b8._8_4_;
              uStack_510._4_4_ = local_4b8._12_4_;
              local_508._0_4_ = local_4b8._16_4_;
              local_508._4_4_ = local_4b8._20_4_;
              local_4f8 = local_498;
              local_4f0 = local_490;
              local_4ec = local_48c;
              local_4e8._0_4_ = (fpclass_type)local_488;
              local_4e8._4_4_ = local_488._4_4_;
              local_558.m_backend.data._M_elems[0] = local_188.data._M_elems[0];
              local_558.m_backend.data._M_elems[1] = local_188.data._M_elems[1];
              local_558.m_backend.data._M_elems[2] = local_188.data._M_elems[2];
              local_558.m_backend.data._M_elems[3] = local_188.data._M_elems[3];
              local_558.m_backend.data._M_elems[4] = local_188.data._M_elems[4];
              local_558.m_backend.data._M_elems[5] = local_188.data._M_elems[5];
              local_558.m_backend.data._M_elems[6] = local_188.data._M_elems[6];
              local_558.m_backend.data._M_elems[7] = local_188.data._M_elems[7];
              local_558.m_backend.data._M_elems[8] = local_188.data._M_elems[8];
              local_558.m_backend.data._M_elems[9] = local_188.data._M_elems[9];
              local_558.m_backend.exp = local_188.exp;
              local_558.m_backend.neg = local_188.neg;
              local_558.m_backend.fpclass = local_188.fpclass;
              local_558.m_backend.prec_elem = local_188.prec_elem;
              local_4b8._0_16_ = auVar10;
              relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                        (&local_590,(soplex *)&local_518,&local_558,pnVar18);
              local_5e8.data._M_elems[8] = local_590.m_backend.data._M_elems[8];
              local_5e8.data._M_elems[9] = local_590.m_backend.data._M_elems[9];
              local_5e8.data._M_elems[1] = local_590.m_backend.data._M_elems[1];
              local_5e8.data._M_elems[0] = local_590.m_backend.data._M_elems[0];
              local_5e8.data._M_elems[2] = local_590.m_backend.data._M_elems[2];
              local_5e8.data._M_elems[3] = local_590.m_backend.data._M_elems[3];
              local_5e8.exp = local_590.m_backend.exp;
              local_5e8.neg = local_590.m_backend.neg;
              local_5e8.fpclass = local_590.m_backend.fpclass;
              local_5e8.prec_elem = local_590.m_backend.prec_elem;
              in_RCX = (ostream **)(local_590.m_backend._48_8_ & P_FREE);
              if ((local_590.m_backend.neg == true) &&
                 (local_590.m_backend.data._M_elems[0] != 0 || local_590.m_backend.fpclass != 0)) {
                local_5e8.neg = false;
              }
              if (((local_590.m_backend.fpclass != 2) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
                 (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_5e8,&local_a8), iVar14 < 1)) {
                DIdxSet::addIdx(&local_608,(int)lVar21);
              }
            }
            lVar21 = lVar21 + 1;
            lVar22 = lVar22 + 0x38;
          } while (lVar21 < (this->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum);
        }
        bVar11 = false;
        while ((uVar19 = (ulong)local_608.super_IdxSet.num, 0 < (long)uVar19 && (!bVar11))) {
          iVar14 = 0;
          do {
            local_610 = (DataKey)id(this,local_608.super_IdxSet.idx[uVar19 - 1]);
            bVar12 = enter(this,(SPxId *)&local_610,true);
            (*(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])(this);
            if (bVar12) {
              iVar14 = iVar14 + 1;
              lVar22 = (long)local_608.super_IdxSet.num;
              local_608.super_IdxSet.num = local_608.super_IdxSet.num + -1;
              in_RCX = (ostream **)(ulong)(uint)local_608.super_IdxSet.idx[lVar22 + -1];
              local_608.super_IdxSet.idx[uVar19 - 1] = local_608.super_IdxSet.idx[lVar22 + -1];
              if ((-1 < this->maxIters) &&
                 (this->maxIters <=
                  (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).iterCount)) {
                bVar11 = true;
              }
            }
            bVar12 = isTimeLimitReached(this,false);
            if (bVar12) {
              bVar11 = true;
            }
          } while ((1 < uVar19) && (uVar19 = uVar19 - 1, !bVar11));
          if ((iVar14 == 0) || (this->polishCount = this->polishCount + iVar14, bVar11)) break;
        }
      }
    }
    else {
      local_5a0 = &(this->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thedesc.colstat.data;
      setType(this,LEAVE);
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x76])(this);
      leavetol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_5e8,this);
      local_3d8[0] = local_5e8.data._M_elems[8];
      local_3d8[1] = local_5e8.data._M_elems[9];
      local_3e8 = local_5e8.data._M_elems[4];
      uStack_3e4 = local_5e8.data._M_elems[5];
      uStack_3e0 = local_5e8.data._M_elems[6];
      uStack_3dc = local_5e8.data._M_elems[7];
      local_3f8[0] = local_5e8.data._M_elems[0];
      local_3f8[1] = local_5e8.data._M_elems[1];
      auStack_3f0[0] = local_5e8.data._M_elems[2];
      auStack_3f0[1] = local_5e8.data._M_elems[3];
      local_594 = local_5e8.exp;
      local_611 = local_5e8.neg;
      local_418._0_4_ = local_5e8.fpclass;
      local_418._4_4_ = local_5e8.prec_elem;
      uStack_410 = 0;
      this->instableLeave = false;
      (*this->theratiotester->_vptr_SPxRatioTester[9])
                (this->theratiotester,(ulong)(uint)this->theType);
      iVar14 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      iVar20 = (this->integerVariables).thesize;
      local_5a8 = (Status *)CONCAT44(local_5a8._4_4_,iVar14);
      local_5b0 = CONCAT44(local_5b0._4_4_,iVar20);
      if (this->polishObj == POLISH_INTEGRALITY) {
        DIdxSet::DIdxSet(&local_608,(this->thecovectors->set).thenum);
        if (0 < (this->thecovectors->set).thenum) {
          local_400 = &(this->
                       super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).thedesc.rowstat.data;
          local_4c0 = &(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set;
          local_4e0 = &(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set;
          lVar22 = 6;
          lVar21 = 0;
          do {
            local_610 = (this->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).theBaseId.data[lVar21].super_DataKey;
            if (local_610.info < 0) {
              iVar15 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                       ::number(local_4e0,&local_610);
              ppSVar17 = local_400;
LAB_00288af9:
              in_RCX = (ostream **)*ppSVar17;
              if ((*(uint *)((long)in_RCX + (long)iVar15 * 4) & 0xfffffffd) == 0xfffffffc) {
                pnVar6 = (this->theFvec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pnVar18 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            **)((pnVar6->m_backend).data._M_elems + lVar22 * 2U + 0xfffffffffffffffc
                               );
                puVar2 = (pnVar6->m_backend).data._M_elems + lVar22 * 2U + 0xfffffffffffffff4;
                local_398 = *(uint (*) [2])puVar2;
                auStack_390 = *(uint (*) [2])(puVar2 + 2);
                puVar2 = (pnVar6->m_backend).data._M_elems + lVar22 * 2U + 0xfffffffffffffff8;
                local_388 = *(uint (*) [2])puVar2;
                uStack_380 = *(undefined8 *)(puVar2 + 2);
                fVar4 = (pnVar6->m_backend).data._M_elems[lVar22 * 2U + 0xfffffffffffffffe];
                iVar9 = (pnVar6->m_backend).data._M_elems[lVar22 * 2U + 0xffffffffffffffff];
                _local_4d8 = *(undefined8 *)((pnVar6->m_backend).data._M_elems + lVar22 * 2);
                uStack_4d0 = 0;
                local_378 = pnVar18;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_1c0,0,(type *)0x0);
                RVar24 = Tolerances::epsilon((this->
                                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             )._tolerances.
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr);
                local_2b8.fpclass = cpp_dec_float_finite;
                local_2b8.prec_elem = 10;
                local_2b8.data._M_elems[0] = 0;
                local_2b8.data._M_elems[1] = 0;
                local_2b8.data._M_elems[2] = 0;
                local_2b8.data._M_elems[3] = 0;
                local_2b8.data._M_elems[4] = 0;
                local_2b8.data._M_elems[5] = 0;
                local_2b8.data._M_elems._24_5_ = 0;
                local_2b8.data._M_elems[7]._1_3_ = 0;
                local_2b8.data._M_elems._32_5_ = 0;
                local_2b8._37_8_ = 0;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&local_2b8,RVar24);
                local_518._0_4_ = local_398[0];
                local_518._4_4_ = local_398[1];
                uStack_510._0_4_ = auStack_390[0];
                uStack_510._4_4_ = auStack_390[1];
                local_508._0_4_ = local_388[0];
                local_508._4_4_ = local_388[1];
                uStack_500 = uStack_380;
                local_4f8 = local_378;
                local_4e8._0_4_ = local_4d8;
                local_4e8._4_4_ = iStack_4d4;
                local_558.m_backend.data._M_elems[0] = local_1c0.data._M_elems[0];
                local_558.m_backend.data._M_elems[1] = local_1c0.data._M_elems[1];
                local_558.m_backend.data._M_elems[2] = local_1c0.data._M_elems[2];
                local_558.m_backend.data._M_elems[3] = local_1c0.data._M_elems[3];
                local_558.m_backend.data._M_elems[4] = local_1c0.data._M_elems[4];
                local_558.m_backend.data._M_elems[5] = local_1c0.data._M_elems[5];
                local_558.m_backend.data._M_elems[6] = local_1c0.data._M_elems[6];
                local_558.m_backend.data._M_elems[7] = local_1c0.data._M_elems[7];
                local_558.m_backend.data._M_elems[8] = local_1c0.data._M_elems[8];
                local_558.m_backend.data._M_elems[9] = local_1c0.data._M_elems[9];
                local_558.m_backend.exp = local_1c0.exp;
                local_558.m_backend.neg = local_1c0.neg;
                local_558.m_backend.fpclass = local_1c0.fpclass;
                local_558.m_backend.prec_elem = local_1c0.prec_elem;
                local_4f0 = fVar4;
                local_4ec = (byte)iVar9;
                relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                          (&local_590,(soplex *)&local_518,&local_558,pnVar18);
                local_5e8.data._M_elems[8] = local_590.m_backend.data._M_elems[8];
                local_5e8.data._M_elems[9] = local_590.m_backend.data._M_elems[9];
                local_5e8.data._M_elems[1] = local_590.m_backend.data._M_elems[1];
                local_5e8.data._M_elems[0] = local_590.m_backend.data._M_elems[0];
                local_5e8.data._M_elems[2] = local_590.m_backend.data._M_elems[2];
                local_5e8.data._M_elems[3] = local_590.m_backend.data._M_elems[3];
                local_5e8.exp = local_590.m_backend.exp;
                local_5e8.neg = local_590.m_backend.neg;
                local_5e8.fpclass = local_590.m_backend.fpclass;
                local_5e8.prec_elem = local_590.m_backend.prec_elem;
                in_RCX = (ostream **)(local_590.m_backend._48_8_ & P_FREE);
                if ((local_590.m_backend.neg == true) &&
                   (local_590.m_backend.data._M_elems[0] != 0 || local_590.m_backend.fpclass != 0))
                {
                  local_5e8.neg = false;
                }
                if ((local_590.m_backend.fpclass == 2) || (local_2b8.fpclass == cpp_dec_float_NaN))
                {
                  iVar14 = (int)local_5a8;
                  iVar20 = (int)local_5b0;
                }
                else {
                  iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_5e8,&local_2b8);
                  iVar14 = (int)local_5a8;
                  iVar20 = (int)local_5b0;
                  if (iVar15 < 1) {
                    DIdxSet::addIdx(&local_608,(int)lVar21);
                  }
                }
              }
            }
            else if (iVar20 == iVar14) {
              SPxColId::SPxColId((SPxColId *)&local_5e8,(SPxId *)&local_610);
              iVar15 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                       ::number(local_4c0,(DataKey *)&local_5e8);
              in_RCX = (ostream **)(this->integerVariables).data;
              if (*(int *)((long)in_RCX + (long)iVar15 * 4) != 1) {
                this_00 = local_4c0;
                if (local_610.info < 1) {
                  this_00 = local_4e0;
                }
                iVar15 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                         ::number(this_00,&local_610);
                ppSVar17 = local_5a0;
                goto LAB_00288af9;
              }
            }
            lVar21 = lVar21 + 1;
            lVar22 = lVar22 + 7;
          } while (lVar21 < (this->thecovectors->set).thenum);
        }
        bVar11 = false;
        while ((uVar19 = (ulong)local_608.super_IdxSet.num, 0 < (long)uVar19 && (!bVar11))) {
          iVar14 = 0;
          do {
            bVar12 = leave(this,local_608.super_IdxSet.idx[uVar19 - 1],true);
            (*(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])(this);
            if (bVar12) {
              iVar14 = iVar14 + 1;
              lVar22 = (long)local_608.super_IdxSet.num;
              local_608.super_IdxSet.num = local_608.super_IdxSet.num + -1;
              in_RCX = (ostream **)(ulong)(uint)local_608.super_IdxSet.idx[lVar22 + -1];
              local_608.super_IdxSet.idx[uVar19 - 1] = local_608.super_IdxSet.idx[lVar22 + -1];
              if ((-1 < this->maxIters) &&
                 (this->maxIters <=
                  (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).iterCount)) {
                bVar11 = true;
              }
            }
            bVar12 = isTimeLimitReached(this,false);
            if (bVar12) {
              bVar11 = true;
            }
          } while ((1 < uVar19) && (uVar19 = uVar19 - 1, !bVar11));
          if ((iVar14 == 0) || (this->polishCount = this->polishCount + iVar14, bVar11)) break;
        }
      }
      else {
        DIdxSet::DIdxSet(&local_608,(this->thecovectors->set).thenum);
        if (0 < (this->thecovectors->set).thenum) {
          local_4e0 = &(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set;
          lVar22 = 0x18;
          lVar21 = 0;
          do {
            local_610 = (this->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).theBaseId.data[lVar21].super_DataKey;
            if (-1 < local_610.info) {
              if (iVar20 == iVar14) {
                SPxColId::SPxColId((SPxColId *)&local_5e8,(SPxId *)&local_610);
                iVar15 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                         ::number(local_4e0,(DataKey *)&local_5e8);
                in_RCX = (ostream **)(this->integerVariables).data;
                if (*(int *)((long)in_RCX + (long)iVar15 * 4) == 0) goto LAB_0028947d;
              }
              if (((*local_5a0)[lVar21] & (P_ON_LOWER|D_FREE)) == P_ON_LOWER) {
                pnVar6 = (this->theFvec->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pnVar18 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            **)((long)(pnVar6->m_backend).data._M_elems + lVar22 * 2 + -0x10);
                puVar2 = (uint *)((long)(pnVar6->m_backend).data._M_elems + lVar22 * 2 + -0x30);
                local_3c8 = *(uint (*) [2])puVar2;
                auStack_3c0 = *(uint (*) [2])(puVar2 + 2);
                puVar2 = (uint *)((long)(pnVar6->m_backend).data._M_elems + lVar22 * 2 + -0x20);
                local_3b8 = *(uint (*) [2])puVar2;
                uStack_3b0 = *(undefined8 *)(puVar2 + 2);
                fVar4 = *(fpclass_type *)((long)(pnVar6->m_backend).data._M_elems + lVar22 * 2 + -8)
                ;
                bVar3 = *(byte *)((long)(pnVar6->m_backend).data._M_elems + lVar22 * 2 + -4);
                _local_4d8 = *(undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar22 * 2);
                uStack_4d0 = 0;
                local_3a8 = pnVar18;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_1f8,0,(type *)0x0);
                RVar24 = Tolerances::epsilon((this->
                                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             )._tolerances.
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr);
                local_2f8.fpclass = cpp_dec_float_finite;
                local_2f8.prec_elem = 10;
                local_2f8.data._M_elems[0] = 0;
                local_2f8.data._M_elems[1] = 0;
                local_2f8.data._M_elems[2] = 0;
                local_2f8.data._M_elems[3] = 0;
                local_2f8.data._M_elems[4] = 0;
                local_2f8.data._M_elems[5] = 0;
                local_2f8.data._M_elems._24_5_ = 0;
                local_2f8.data._M_elems[7]._1_3_ = 0;
                local_2f8.data._M_elems._32_5_ = 0;
                local_2f8._37_8_ = 0;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&local_2f8,RVar24);
                local_518._0_4_ = local_3c8[0];
                local_518._4_4_ = local_3c8[1];
                uStack_510._0_4_ = auStack_3c0[0];
                uStack_510._4_4_ = auStack_3c0[1];
                local_508._0_4_ = local_3b8[0];
                local_508._4_4_ = local_3b8[1];
                uStack_500 = uStack_3b0;
                local_4f8 = local_3a8;
                local_4e8._0_4_ = local_4d8;
                local_4e8._4_4_ = iStack_4d4;
                local_558.m_backend.data._M_elems[0] = local_1f8.data._M_elems[0];
                local_558.m_backend.data._M_elems[1] = local_1f8.data._M_elems[1];
                local_558.m_backend.data._M_elems[2] = local_1f8.data._M_elems[2];
                local_558.m_backend.data._M_elems[3] = local_1f8.data._M_elems[3];
                local_558.m_backend.data._M_elems[4] = local_1f8.data._M_elems[4];
                local_558.m_backend.data._M_elems[5] = local_1f8.data._M_elems[5];
                local_558.m_backend.data._M_elems[6] = local_1f8.data._M_elems[6];
                local_558.m_backend.data._M_elems[7] = local_1f8.data._M_elems[7];
                local_558.m_backend.data._M_elems[8] = local_1f8.data._M_elems[8];
                local_558.m_backend.data._M_elems[9] = local_1f8.data._M_elems[9];
                local_558.m_backend.exp = local_1f8.exp;
                local_558.m_backend.neg = local_1f8.neg;
                local_558.m_backend.fpclass = local_1f8.fpclass;
                local_558.m_backend.prec_elem = local_1f8.prec_elem;
                local_4f0 = fVar4;
                local_4ec = bVar3;
                relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                          (&local_590,(soplex *)&local_518,&local_558,pnVar18);
                local_5e8.data._M_elems[8] = local_590.m_backend.data._M_elems[8];
                local_5e8.data._M_elems[9] = local_590.m_backend.data._M_elems[9];
                local_5e8.data._M_elems[1] = local_590.m_backend.data._M_elems[1];
                local_5e8.data._M_elems[0] = local_590.m_backend.data._M_elems[0];
                local_5e8.data._M_elems[2] = local_590.m_backend.data._M_elems[2];
                local_5e8.data._M_elems[3] = local_590.m_backend.data._M_elems[3];
                local_5e8.exp = local_590.m_backend.exp;
                local_5e8.neg = local_590.m_backend.neg;
                local_5e8.fpclass = local_590.m_backend.fpclass;
                local_5e8.prec_elem = local_590.m_backend.prec_elem;
                in_RCX = (ostream **)(local_590.m_backend._48_8_ & P_FREE);
                if ((local_590.m_backend.neg == true) &&
                   (local_590.m_backend.data._M_elems[0] != 0 || local_590.m_backend.fpclass != 0))
                {
                  local_5e8.neg = false;
                }
                if ((local_590.m_backend.fpclass == 2) || (local_2f8.fpclass == cpp_dec_float_NaN))
                {
                  iVar14 = (int)local_5a8;
                  iVar20 = (int)local_5b0;
                }
                else {
                  iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_5e8,&local_2f8);
                  iVar14 = (int)local_5a8;
                  iVar20 = (int)local_5b0;
                  if (iVar15 < 1) {
                    DIdxSet::addIdx(&local_608,(int)lVar21);
                  }
                }
              }
            }
LAB_0028947d:
            lVar21 = lVar21 + 1;
            lVar22 = lVar22 + 0x1c;
          } while (lVar21 < (this->thecovectors->set).thenum);
        }
        bVar11 = false;
        while ((uVar19 = (ulong)local_608.super_IdxSet.num, 0 < (long)uVar19 && (!bVar11))) {
          iVar14 = 0;
          do {
            bVar12 = leave(this,local_608.super_IdxSet.idx[uVar19 - 1],true);
            (*(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])(this);
            if (bVar12) {
              iVar14 = iVar14 + 1;
              lVar22 = (long)local_608.super_IdxSet.num;
              local_608.super_IdxSet.num = local_608.super_IdxSet.num + -1;
              in_RCX = (ostream **)(ulong)(uint)local_608.super_IdxSet.idx[lVar22 + -1];
              local_608.super_IdxSet.idx[uVar19 - 1] = local_608.super_IdxSet.idx[lVar22 + -1];
              if ((-1 < this->maxIters) &&
                 (this->maxIters <=
                  (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).iterCount)) {
                bVar11 = true;
              }
            }
            bVar12 = isTimeLimitReached(this,false);
            if (bVar12) {
              bVar11 = true;
            }
          } while ((1 < uVar19) && (uVar19 = uVar19 - 1, !bVar11));
          if ((iVar14 == 0) || (this->polishCount = this->polishCount + iVar14, bVar11)) break;
        }
      }
    }
    DIdxSet::~DIdxSet(&local_608);
    pSVar5 = this->spxout;
    if ((pSVar5 != (SPxOut *)0x0) && (2 < (int)pSVar5->m_verbosity)) {
      local_5e8.data._M_elems[0] = pSVar5->m_verbosity;
      local_590.m_backend.data._M_elems[0] = 3;
      (*pSVar5->_vptr_SPxOut[2])();
      pSVar5 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar5->m_streams[pSVar5->m_verbosity]," --- finished solution polishing (",0x22);
      std::ostream::operator<<((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],this->polishCount);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar5->m_streams[pSVar5->m_verbosity]," pivots)",8);
      in_RCX = pSVar5->m_streams;
      cVar7 = (char)in_RCX[pSVar5->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)in_RCX[pSVar5->m_verbosity] + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_5e8);
    }
    if ((this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thestatus != OPTIMAL) {
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thestatus = OPTIMAL;
    }
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x5e])(&local_68,this);
    local_558.m_backend.data._M_elems[8] = local_c0[0];
    local_558.m_backend.data._M_elems[9] = local_c0[1];
    local_558.m_backend.data._M_elems[4] = local_d0[0];
    local_558.m_backend.data._M_elems[5] = local_d0[1];
    local_558.m_backend.data._M_elems[6] = auStack_c8[0];
    local_558.m_backend.data._M_elems[7] = auStack_c8[1];
    local_558.m_backend.data._M_elems[0] = local_e0[0];
    local_558.m_backend.data._M_elems[1] = local_e0[1];
    local_558.m_backend.data._M_elems[2] = auStack_d8[0];
    local_558.m_backend.data._M_elems[3] = auStack_d8[1];
    local_338.data._M_elems[5] = uStack_3e4;
    local_338.data._M_elems[4] = local_3e8;
    local_338.data._M_elems[7] = uStack_3dc;
    local_338.data._M_elems[6] = uStack_3e0;
    local_338.data._M_elems[0] = local_3f8[0];
    local_338.data._M_elems[1] = local_3f8[1];
    local_338.data._M_elems[2] = auStack_3f0[0];
    local_338.data._M_elems[3] = auStack_3f0[1];
    local_338.data._M_elems[8] = local_3d8[0];
    local_338.data._M_elems[9] = local_3d8[1];
    local_338.exp = local_594;
    local_338.neg = (bool)local_611;
    local_338.fpclass = (int)local_418;
    local_338.prec_elem = local_418._4_4_;
    local_518 = local_68;
    uStack_510 = uStack_60;
    local_508 = local_58;
    uStack_500 = uStack_50;
    local_4f8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_48;
    local_4f0 = local_40;
    local_4ec = local_3c;
    local_4e8 = local_38;
    local_558.m_backend.exp = local_b8;
    local_558.m_backend.neg = (bool)local_b4;
    local_558.m_backend.fpclass = local_b0;
    local_558.m_backend.prec_elem = iStack_ac;
    relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              (&local_590,(soplex *)&local_518,&local_558,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)CONCAT71((int7)((ulong)in_RCX >> 8),local_b4));
    local_5e8.data._M_elems[8] = local_590.m_backend.data._M_elems[8];
    local_5e8.data._M_elems[9] = local_590.m_backend.data._M_elems[9];
    local_5e8.data._M_elems[1] = local_590.m_backend.data._M_elems[1];
    local_5e8.data._M_elems[0] = local_590.m_backend.data._M_elems[0];
    local_5e8.data._M_elems[2] = local_590.m_backend.data._M_elems[2];
    local_5e8.data._M_elems[3] = local_590.m_backend.data._M_elems[3];
    local_5e8.exp = local_590.m_backend.exp;
    local_5e8.neg = local_590.m_backend.neg;
    local_5e8.fpclass = local_590.m_backend.fpclass;
    local_5e8.prec_elem = local_590.m_backend.prec_elem;
    if ((local_590.m_backend.neg == true) &&
       (local_590.m_backend.data._M_elems[0] != 0 || local_590.m_backend.fpclass != 0)) {
      local_5e8.neg = false;
    }
    bVar11 = true;
    if ((local_590.m_backend.fpclass != 2) && ((int)local_418 != 2)) {
      iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_5e8,&local_338);
      bVar11 = 0 < iVar14;
    }
  }
  return bVar11;
}

Assistant:

bool SPxSolverBase<R>::performSolutionPolishing()
{
   // catch rare case that the iteration limit is exactly reached at optimality
   bool stop = (maxIters >= 0 && iterations() >= maxIters && !isTimeLimitReached());

   // only polish an already optimal basis
   if(stop || polishObj == POLISH_OFF || status() != OPTIMAL)
      return false;

   int nSuccessfulPivots;
   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   const typename SPxBasisBase<R>::Desc::Status* rowstatus = ds.rowStatus();
   const typename SPxBasisBase<R>::Desc::Status* colstatus = ds.colStatus();
   typename SPxBasisBase<R>::Desc::Status stat;
   SPxId polishId;
   bool success = false;

   R alloweddeviation;
   R origval = value();

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- perform solution polishing" << std::endl;)

   if(rep() == COLUMN)
   {
      setType(ENTER); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = entertol();

      instableEnter = false;
      theratiotester->setType(type());

      int nrows = this->nRows();
      int ncols = this->nCols();

      assert(nrows >= 0);
      assert(ncols >= 0);

      if(polishObj == POLISH_INTEGRALITY)
      {
         DIdxSet slackcandidates(nrows);
         DIdxSet continuousvars(ncols);

         // collect nonbasic slack variables that could be made basic
         for(int i = 0; i < nrows; ++i)
         {
            // only check nonbasic rows, skip equations
            if(rowstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_LOWER
                  || rowstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider rows with zero dual multiplier to preserve optimality
               if(EQrel((*theCoPvec)[i], (R) 0, this->epsilon()))
                  slackcandidates.addIdx(i);
            }
         }

         // collect continuous variables that could be made basic
         if(integerVariables.size() == ncols)
         {
            for(int i = 0; i < ncols; ++i)
            {
               // skip fixed variables
               if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                     || colstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
               {
                  // only consider continuous variables with zero dual multiplier to preserve optimality
                  if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()) && integerVariables[i] == 0)
                     continuousvars.addIdx(i);
               }
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            // identify nonbasic slack variables, i.e. rows, that may be moved into the basis
            for(int i = slackcandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = coId(slackcandidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, rowstatus[slackcandidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  slackcandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // identify nonbasic variables that may be moved into the basis
            for(int i = continuousvars.size() - 1; i >= 0 && !stop; --i)
            {
               polishId = id(continuousvars.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[continuousvars.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  continuousvars.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet candidates(dim());

         // identify nonbasic variables, i.e. columns, that may be moved into the basis
         for(int i = 0; i < this->nCols() && !stop; ++i)
         {
            if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || colstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider variables with zero reduced costs to preserve optimality
               if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()))
                  candidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = candidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = id(candidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[candidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  candidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }
   else
   {
      setType(LEAVE); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = leavetol();
      instableLeave = false;
      theratiotester->setType(type());
      bool useIntegrality = false;
      int ncols = this->nCols();

      if(integerVariables.size() == ncols)
         useIntegrality = true;

      // in ROW rep: pivot slack out of the basis
      if(polishObj == POLISH_INTEGRALITY)
      {
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic candidates that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               stat = ds.rowStatus(this->number(polishId));
            else
            {
               // skip (integer) variables
               if(!useIntegrality || integerVariables[this->number(SPxColId(polishId))] == 1)
                  continue;

               stat = ds.colStatus(this->number(polishId));
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic (integer) variables, that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               continue;
            else
            {
               if(useIntegrality && integerVariables[this->number(SPxColId(polishId))] == 0)
                  continue;

               stat = ds.colStatus(i);
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }

   SPX_MSG_INFO1((*this->spxout),
                 (*this->spxout) << " --- finished solution polishing (" << polishCount << " pivots)" << std::endl;)

   this->setStatus(SPxBasisBase<R>::OPTIMAL);

   // if the value() changed significantly (due to numerics) reoptimize after polishing
   if(!EQrel(value(), origval, alloweddeviation))
      return true;
   else
      return false;
}